

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O1

bool rsg::anon_unknown_13::
     compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
               (ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  Type TVar6;
  VariableType *pVVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  ConstValueRangeAccess local_60;
  ConstValueRangeAccess local_48;
  
  pVVar7 = a->m_type;
  TVar6 = pVVar7->m_baseType;
  if (TVar6 == TYPE_ARRAY) {
    iVar9 = pVVar7->m_numElements;
    bVar16 = 0 < iVar9;
    if (0 < iVar9) {
      iVar12 = 0;
      do {
        iVar10 = VariableType::getElementScalarOffset(a->m_type,iVar12);
        local_48.m_type = VariableType::getElementType(a->m_type);
        local_48.m_min = a->m_min + iVar10;
        local_48.m_max = a->m_max + iVar10;
        iVar10 = VariableType::getElementScalarOffset(b->m_type,iVar12);
        local_60.m_type = VariableType::getElementType(b->m_type);
        local_60.m_min = b->m_min + iVar10;
        local_60.m_max = b->m_max + iVar10;
        bVar8 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
                          (&local_48,&local_60);
        if (!bVar8) {
          if (bVar16) {
            return false;
          }
          break;
        }
        iVar12 = iVar12 + 1;
        bVar16 = iVar12 < iVar9;
      } while (iVar12 != iVar9);
    }
  }
  else if (TVar6 == TYPE_STRUCT) {
    uVar11 = (int)((long)(pVVar7->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pVVar7->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
    bVar16 = 0 < (int)uVar11;
    if (0 < (int)uVar11) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        iVar9 = VariableType::getMemberScalarOffset(a->m_type,(int)uVar14);
        local_48.m_type =
             *(VariableType **)
              ((long)&((a->m_type->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar13);
        local_48.m_min = a->m_min + iVar9;
        local_48.m_max = a->m_max + iVar9;
        iVar9 = VariableType::getMemberScalarOffset(b->m_type,(int)uVar14);
        local_60.m_min = b->m_min + iVar9;
        local_60.m_max = b->m_max + iVar9;
        local_60.m_type =
             *(VariableType **)
              ((long)&((b->m_type->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar13);
        bVar8 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
                          (&local_48,&local_60);
        if (!bVar8) {
          if (bVar16) {
            return false;
          }
          break;
        }
        uVar14 = uVar14 + 1;
        bVar16 = uVar14 < (uVar11 & 0x7fffffff);
        lVar13 = lVar13 + 0x28;
      } while ((uVar11 & 0x7fffffff) != uVar14);
    }
  }
  else {
    bVar16 = false;
    if (6 < TVar6 - TYPE_FLOAT) {
      return false;
    }
    uVar11 = pVVar7->m_numElements;
    uVar14 = (ulong)uVar11;
    switch(TVar6) {
    case TYPE_FLOAT:
      bVar16 = 0 < (int)uVar11;
      if (0 < (int)uVar11) {
        uVar15 = 1;
        do {
          VariableType::getElementType(a->m_type);
          fVar1 = a->m_min[uVar15 - 1].floatVal;
          VariableType::getElementType(a->m_type);
          fVar2 = a->m_max[uVar15 - 1].floatVal;
          VariableType::getElementType(b->m_type);
          fVar3 = b->m_min[uVar15 - 1].floatVal;
          VariableType::getElementType(b->m_type);
          if ((fVar2 < fVar3) || (b->m_max[uVar15 - 1].floatVal < fVar1)) {
            if (bVar16) {
              return false;
            }
            break;
          }
          bVar16 = uVar15 < uVar14;
          bVar8 = uVar15 != uVar14;
          uVar15 = uVar15 + 1;
        } while (bVar8);
      }
      break;
    default:
      bVar16 = 0 < (int)uVar11;
      if (0 < (int)uVar11) {
        lVar13 = 0;
        do {
          VariableType::getElementType(a->m_type);
          iVar9 = a->m_min[lVar13].intVal;
          VariableType::getElementType(a->m_type);
          iVar12 = a->m_max[lVar13].intVal;
          VariableType::getElementType(b->m_type);
          iVar10 = b->m_min[lVar13].intVal;
          VariableType::getElementType(b->m_type);
          if ((iVar12 < iVar10) || (b->m_max[lVar13].intVal < iVar9)) goto LAB_005bd72c;
          lVar13 = lVar13 + 1;
          bVar16 = (int)(uint)lVar13 < (int)uVar11;
        } while (uVar11 != (uint)lVar13);
      }
      break;
    case TYPE_BOOL:
      bVar16 = 0 < (int)uVar11;
      if (0 < (int)uVar11) {
        uVar15 = 1;
        do {
          VariableType::getElementType(a->m_type);
          bVar8 = a->m_min[uVar15 - 1].boolVal;
          VariableType::getElementType(a->m_type);
          bVar4 = a->m_max[uVar15 - 1].boolVal;
          VariableType::getElementType(b->m_type);
          bVar5 = b->m_min[uVar15 - 1].boolVal;
          VariableType::getElementType(b->m_type);
          if (((byte)(bVar5 ^ 1U | bVar4) != 1) ||
             (bVar8 == true && b->m_max[uVar15 - 1].boolVal == false)) goto LAB_005bd72c;
          bVar16 = uVar15 < uVar14;
          bVar8 = uVar15 != uVar14;
          uVar15 = uVar15 + 1;
        } while (bVar8);
      }
      break;
    case TYPE_STRUCT:
    case TYPE_ARRAY:
      goto switchD_005bd5fc_caseD_4;
    }
  }
  goto LAB_005bd7f0;
LAB_005bd72c:
  if (bVar16) {
    return false;
  }
LAB_005bd7f0:
  bVar16 = true;
switchD_005bd5fc_caseD_4:
  return bVar16;
}

Assistant:

bool compareValueRangesAllTrue (const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	DE_ASSERT(a.getType() == b.getType());

	if (a.getType().isStruct())
	{
		int numMembers = (int)a.getType().getMembers().size();
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.member(ndx), b.member(ndx)))
				return false;
		}
	}
	else if (a.getType().isArray())
	{
		int numElements = (int)a.getType().getNumElements();
		for (int ndx = 0; ndx < numElements; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.arrayElement(ndx), b.arrayElement(ndx)))
				return false;
		}
	}
	else
	{
		int numElements = (int)a.getType().getNumElements();
		switch (a.getType().getBaseType())
		{
			case VariableType::TYPE_FLOAT:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					float aMin = a.component(ndx).getMin().asFloat();
					float aMax = a.component(ndx).getMax().asFloat();
					float bMin = b.component(ndx).getMin().asFloat();
					float bMax = b.component(ndx).getMax().asFloat();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_INT:
			case VariableType::TYPE_SAMPLER_2D:
			case VariableType::TYPE_SAMPLER_CUBE:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					int aMin = a.component(ndx).getMin().asInt();
					int aMax = a.component(ndx).getMax().asInt();
					int bMin = b.component(ndx).getMin().asInt();
					int bMax = b.component(ndx).getMax().asInt();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_BOOL:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					bool aMin = a.component(ndx).getMin().asBool();
					bool aMax = a.component(ndx).getMax().asBool();
					bool bMin = b.component(ndx).getMin().asBool();
					bool bMax = b.component(ndx).getMax().asBool();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			default:
				DE_ASSERT(DE_FALSE);
				return false;
		}
	}

	return true;
}